

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc_unittest.cc
# Opt level: O2

void __thiscall AllocatorState::AllocatorState(AllocatorState *this,int seed)

{
  long lVar1;
  
  (this->super_TestHarness).types_.
  super__Vector_base<TestHarness::Type,_std::allocator<TestHarness::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_TestHarness).total_weight_ = 0;
  (this->super_TestHarness).num_tests_ = 0;
  (this->super_TestHarness).types_.
  super__Vector_base<TestHarness::Type,_std::allocator<TestHarness::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_TestHarness).types_.
  super__Vector_base<TestHarness::Type,_std::allocator<TestHarness::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  srandom(seed);
  this->_vptr_AllocatorState = (_func_int **)&PTR__AllocatorState_00156d50;
  this->memalign_fraction_ = 0.0;
  lVar1 = random();
  this->memalign_fraction_ = ((double)(int)(lVar1 % 10000) / 10000.0) * 0.4 + 0.0;
  return;
}

Assistant:

explicit AllocatorState(int seed) : TestHarness(seed), memalign_fraction_(0) {
    if (kOSSupportsMemalign) {
      CHECK_GE(FLAGS_memalign_max_fraction, 0);
      CHECK_LE(FLAGS_memalign_max_fraction, 1);
      CHECK_GE(FLAGS_memalign_min_fraction, 0);
      CHECK_LE(FLAGS_memalign_min_fraction, 1);
      double delta = FLAGS_memalign_max_fraction - FLAGS_memalign_min_fraction;
      CHECK_GE(delta, 0);
      memalign_fraction_ = (Uniform(10000)/10000.0 * delta +
                            FLAGS_memalign_min_fraction);
      //printf("memalign fraction: %f\n", memalign_fraction_);
    }
  }